

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O3

void ncnn::convolution_im2col_sgemm_transform_kernel_int8_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  uint _w;
  uint _w_00;
  int _h;
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  int k_1;
  ulong uVar4;
  int k;
  ulong uVar5;
  ulong uVar6;
  int j;
  long lVar7;
  int i;
  ulong uVar8;
  int j_1;
  Mat local_80;
  ulong local_38;
  
  _w_00 = kernel_w * kernel_h;
  uVar4 = 0;
  Mat::reshape(&local_80,_kernel,_w_00,inch,outch,(Allocator *)0x0);
  if (outch < 4) {
    iVar1 = ((uint)inch >> 2) * -3;
    _w = _w_00 * 4;
    if (inch < 4) {
      iVar1 = 0;
      _w = _w_00;
    }
    Mat::create(kernel_tm,_w,iVar1 + inch,outch,1,(Allocator *)0x0);
  }
  else {
    if (inch < 4) {
      iVar1 = _w_00 * 4;
      _h = inch;
    }
    else {
      iVar1 = _w_00 * 0x10;
      _h = inch + ((uint)inch >> 2) * -3;
    }
    Mat::create(kernel_tm,iVar1,_h,outch + ((uint)outch >> 2) * -3,1,(Allocator *)0x0);
    uVar6 = uVar4;
    do {
      pvVar2 = (void *)((uVar6 >> 2) * kernel_tm->cstep * kernel_tm->elemsize +
                       (long)kernel_tm->data);
      if (inch < 4) {
        uVar4 = 0;
      }
      else {
        uVar5 = 0;
        do {
          if (0 < (int)_w_00) {
            uVar4 = 0;
            do {
              uVar8 = 0;
              do {
                pvVar3 = pvVar2;
                lVar7 = 0;
                do {
                  *(undefined1 *)((long)pvVar3 + lVar7) =
                       *(undefined1 *)
                        ((long)local_80.data +
                        uVar4 + (uVar5 + lVar7) * (long)local_80.w * local_80.elemsize +
                                local_80.cstep * (uVar8 | uVar6) * local_80.elemsize);
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 4);
                uVar8 = uVar8 + 1;
                pvVar2 = (void *)((long)pvVar3 + 4);
              } while (uVar8 != 4);
              uVar4 = uVar4 + 1;
              pvVar2 = (void *)((long)pvVar3 + 4);
            } while (uVar4 != _w_00);
            pvVar2 = (void *)((long)pvVar3 + 4);
          }
          uVar4 = uVar5 + 4;
          lVar7 = uVar5 + 7;
          uVar5 = uVar4;
        } while (lVar7 < inch);
      }
      if ((int)uVar4 < inch) {
        uVar4 = uVar4 & 0xffffffff;
        do {
          if (0 < (int)_w_00) {
            uVar5 = 0;
            do {
              pvVar3 = pvVar2;
              lVar7 = 0;
              do {
                *(undefined1 *)((long)pvVar3 + lVar7) =
                     *(undefined1 *)
                      ((long)local_80.data +
                      uVar5 + (long)local_80.w * uVar4 * local_80.elemsize +
                              (uVar6 + lVar7) * local_80.cstep * local_80.elemsize);
                lVar7 = lVar7 + 1;
              } while (lVar7 != 4);
              uVar5 = uVar5 + 1;
              pvVar2 = (void *)((long)pvVar3 + 4);
            } while (uVar5 != _w_00);
            pvVar2 = (void *)((long)pvVar3 + 4);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 != (uint)inch);
      }
      uVar4 = uVar6 + 4;
      uVar5 = uVar6 + 7;
      uVar6 = uVar4;
      local_38 = (ulong)(uint)outch;
    } while (uVar5 < (uint)outch);
  }
  if ((int)uVar4 < outch) {
    uVar4 = uVar4 & 0xffffffff;
    do {
      pvVar2 = (void *)((ulong)(((uint)uVar4 & 3) + ((uint)(uVar4 >> 2) & 0x3fffffff)) *
                        kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data);
      if (inch < 4) {
        uVar6 = 0;
      }
      else {
        uVar5 = 0;
        do {
          if (0 < (int)_w_00) {
            uVar6 = 0;
            do {
              pvVar3 = pvVar2;
              lVar7 = 0;
              do {
                *(undefined1 *)((long)pvVar3 + lVar7) =
                     *(undefined1 *)
                      ((long)local_80.data +
                      uVar6 + (uVar5 + lVar7) * (long)local_80.w * local_80.elemsize +
                              local_80.cstep * uVar4 * local_80.elemsize);
                lVar7 = lVar7 + 1;
              } while (lVar7 != 4);
              uVar6 = uVar6 + 1;
              pvVar2 = (void *)((long)pvVar3 + 4);
            } while (uVar6 != _w_00);
            pvVar2 = (void *)((long)pvVar3 + 4);
          }
          uVar6 = uVar5 + 4;
          lVar7 = uVar5 + 7;
          uVar5 = uVar6;
        } while (lVar7 < inch);
      }
      if ((int)uVar6 < inch) {
        uVar6 = uVar6 & 0xffffffff;
        do {
          if (0 < (int)_w_00) {
            uVar5 = 0;
            do {
              *(undefined1 *)((long)pvVar2 + uVar5) =
                   *(undefined1 *)
                    ((long)local_80.data +
                    uVar5 + ((long)local_80.w * uVar6 + local_80.cstep * uVar4) * local_80.elemsize)
              ;
              uVar5 = uVar5 + 1;
            } while (_w_00 != uVar5);
            pvVar2 = (void *)((long)pvVar2 + uVar5);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != (uint)inch);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)outch);
  }
  if (local_80.refcount != (int *)0x0) {
    LOCK();
    *local_80.refcount = *local_80.refcount + -1;
    UNLOCK();
    if (*local_80.refcount == 0) {
      if (local_80.allocator == (Allocator *)0x0) {
        if (local_80.data != (void *)0x0) {
          free(local_80.data);
        }
      }
      else {
        (*(local_80.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_int8_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

#if __SSE2__
    // interleave
    // src = maxk-inch-outch
    // dst = 4a-4b-maxk-inch/4a-outch/4b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    if (outch >= 4)
    {
        if (inch >= 4)
            kernel_tm.create(16 * maxk, inch / 4 + inch % 4, outch / 4 + outch % 4, (size_t)1u);
        else
            kernel_tm.create(4 * maxk, inch, outch / 4 + outch % 4, (size_t)1u);
    }
    else
    {
        if (inch >= 4)
            kernel_tm.create(4 * maxk, inch / 4 + inch % 4, outch, (size_t)1u);
        else
            kernel_tm.create(1 * maxk, inch, outch, (size_t)1u);
    }

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        signed char* g00 = kernel_tm.channel(q / 4);

        int p = 0;
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 4; j++)
                    {
                        const signed char* k00 = kernel.channel(q + i).row<const signed char>(p + j);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    const signed char* k00 = kernel.channel(q + i).row<const signed char>(p);

                    g00[0] = k00[k];

                    g00++;
                }
            }
        }
    }
    // TODO unroll 2
    for (; q < outch; q++)
    {
        signed char* g00 = kernel_tm.channel(q / 4 + q % 4);

        int p = 0;
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int j = 0; j < 4; j++)
                {
                    const signed char* k00 = kernel.channel(q).row<const signed char>(p + j);

                    g00[0] = k00[k];

                    g00++;
                }
            }
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                const signed char* k00 = kernel.channel(q).row<const signed char>(p);

                g00[0] = k00[k];

                g00++;
            }
        }
    }
#else  // __SSE2__
    kernel_tm = _kernel.reshape(maxk, inch, outch);
#endif // __SSE2__
}